

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall
ON_PolyCurve::GetBBox(ON_PolyCurve *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_Curve *pOVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar2 = (uint)(0 < lVar3);
  lVar4 = 0;
  while ((lVar4 < lVar3 && ((uVar2 & 1) != 0))) {
    pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar4];
    uVar2 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                      (pOVar1,boxmin,boxmax,(ulong)(bGrowBox & 1));
    lVar4 = lVar4 + 1;
    bGrowBox = true;
  }
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool ON_PolyCurve::GetBBox( // returns true if successful
         double* boxmin,    // minimum
         double* boxmax,    // maximum
         bool bGrowBox
         ) const
{
  const int count = Count();
  int segment_index;
  bool rc = (count>0) ? true : false;
  for ( segment_index = 0; segment_index < count && rc; segment_index++ ) {
    rc = m_segment[segment_index]->GetBBox( boxmin, boxmax, bGrowBox );
    bGrowBox = true;
  }
  return rc;
}